

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

BOOL __thiscall Js::JavascriptArray::SetLength(JavascriptArray *this,Var newLength)

{
  ThreadContext *this_00;
  bool bVar1;
  uint32 newLength_00;
  ScriptContext *scriptContext;
  double dVar2;
  
  bVar1 = TaggedInt::Is(newLength);
  if (bVar1) {
    newLength_00 = TaggedInt::ToInt32(newLength);
    if ((int)newLength_00 < 0) {
      scriptContext =
           (((((this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr)->
             javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
      bVar1 = ThreadContext::RecordImplicitException(scriptContext->threadContext);
      if (!bVar1) {
        return 1;
      }
LAB_00a44403:
      JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ec5a,(PCWSTR)0x0);
    }
  }
  else {
    scriptContext =
         (((((this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr)->
           javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    newLength_00 = JavascriptConversion::ToUInt32(newLength,scriptContext);
    dVar2 = JavascriptConversion::ToNumber(newLength,scriptContext);
    this_00 = scriptContext->threadContext;
    if ((dVar2 != (double)newLength_00) || (NAN(dVar2) || NAN((double)newLength_00))) {
      if ((this_00->implicitCallFlags != ImplicitCall_None) &&
         ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag)) {
        return 1;
      }
      bVar1 = ThreadContext::RecordImplicitException(this_00);
      if (!bVar1) {
        return 1;
      }
      goto LAB_00a44403;
    }
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
  }
  SetLength(this,newLength_00);
  return 1;
}

Assistant:

BOOL JavascriptArray::SetLength(Var newLength)
    {
        ScriptContext *scriptContext;
        if(TaggedInt::Is(newLength))
        {
            int32 lenValue = TaggedInt::ToInt32(newLength);
            if (lenValue < 0)
            {
                scriptContext = GetScriptContext();
                if (scriptContext->GetThreadContext()->RecordImplicitException())
                {
                    JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthAssignIncorrect);
                }
            }
            else
            {
                this->SetLength(lenValue);
            }
            return TRUE;
        }

        scriptContext = GetScriptContext();
        uint32 uintValue = JavascriptConversion::ToUInt32(newLength, scriptContext);
        double dblValue = JavascriptConversion::ToNumber(newLength, scriptContext);
        if (dblValue == uintValue)
        {
            // Conversion can change the type (e.g. from String), invalidating assumptions made by the JIT
            scriptContext->GetThreadContext()->AddImplicitCallFlags(ImplicitCall_Accessor);

            this->SetLength(uintValue);
        }
        else
        {
            ThreadContext* threadContext = scriptContext->GetThreadContext();
            ImplicitCallFlags flags = threadContext->GetImplicitCallFlags();
            if (flags != ImplicitCall_None && threadContext->IsDisableImplicitCall())
            {
                // We couldn't execute the implicit call(s) needed to convert the newLength to an integer.
                // Do nothing and let the jitted code bail out.
                return TRUE;
            }

            if (threadContext->RecordImplicitException())
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthAssignIncorrect);
            }
        }

        return TRUE;
    }